

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_escaped_cp<fmt::v9::appender,char>
                   (appender out,find_escape_result<char> *escape)

{
  appender aVar1;
  type count;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> out_00;
  undefined8 *in_RSI;
  buffer<char> *in_RDI;
  char escape_char;
  iterator __end0;
  iterator __begin0;
  basic_string_view<char> *__range4;
  char c;
  value_type *in_stack_ffffffffffffff38;
  char *s;
  undefined4 in_stack_ffffffffffffff40;
  int iVar2;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_b8;
  buffer<char> *local_b0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_a8;
  uint32_t in_stack_ffffffffffffff60;
  char in_stack_ffffffffffffff67;
  appender in_stack_ffffffffffffff68;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_90;
  basic_string_view<char> local_88;
  basic_string_view<char> *local_78;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_58;
  undefined1 local_49;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_48;
  undefined1 local_39;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_38;
  undefined1 local_29;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_28;
  undefined1 local_1a;
  undefined1 local_19;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_10 [2];
  
  local_19 = *(undefined1 *)(in_RSI + 2);
  iVar2 = *(int *)(in_RSI + 2);
  local_10[0].container = in_RDI;
  if (iVar2 == 9) {
    local_39 = 0x5c;
    local_48.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_48);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
    local_19 = 0x74;
  }
  else if (iVar2 == 10) {
    local_1a = 0x5c;
    local_28.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_28);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
    local_19 = 0x6e;
  }
  else if (iVar2 == 0xd) {
    local_29 = 0x5c;
    local_38.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
    local_19 = 0x72;
  }
  else {
    if (((iVar2 != 0x22) && (iVar2 != 0x27)) && (iVar2 != 0x5c)) {
      if (*(uint *)(in_RSI + 2) < 0x100) {
        aVar1 = write_codepoint<2ul,char,fmt::v9::appender>
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,
                           in_stack_ffffffffffffff60);
        return (appender)
               aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if (*(uint *)(in_RSI + 2) < 0x10000) {
        aVar1 = write_codepoint<4ul,char,fmt::v9::appender>
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,
                           in_stack_ffffffffffffff60);
        return (appender)
               aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if (*(uint *)(in_RSI + 2) < 0x110000) {
        aVar1 = write_codepoint<8ul,char,fmt::v9::appender>
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,
                           in_stack_ffffffffffffff60);
        return (appender)
               aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      s = (char *)*in_RSI;
      count = to_unsigned<long>(0x1bf5aa);
      basic_string_view<char>::basic_string_view(&local_88,s,count);
      local_78 = &local_88;
      local_90.container = (buffer<char> *)basic_string_view<char>::begin(local_78);
      out_00.container = (buffer<char> *)basic_string_view<char>::end(local_78);
      for (; local_90.container != out_00.container;
          local_90.container = (buffer<char> *)((long)&(local_90.container)->_vptr_buffer + 1)) {
        local_b0 = local_10[0].container;
        local_a8.container =
             (buffer<char> *)
             write_codepoint<2ul,char,fmt::v9::appender>
                       (out_00.container,*(char *)&(local_90.container)->_vptr_buffer,
                        in_stack_ffffffffffffff60);
        local_10[0].container = local_a8.container;
      }
      return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_10[0].container;
    }
    local_49 = 0x5c;
    local_58.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_58);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
  }
  local_b8.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_b8);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_10[0].container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (is_utf8()) {
      if (escape.cp < 0x100) {
        return write_codepoint<2, Char>(out, 'x', escape.cp);
      }
      if (escape.cp < 0x10000) {
        return write_codepoint<4, Char>(out, 'u', escape.cp);
      }
      if (escape.cp < 0x110000) {
        return write_codepoint<8, Char>(out, 'U', escape.cp);
      }
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}